

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O1

void __thiscall params::params(params *this,int argc,char **argv)

{
  size_t *psVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  _List_node_base *p_Var6;
  long *plVar7;
  invalid_argument *piVar8;
  long *plVar9;
  bool bVar10;
  bool bVar11;
  __integer_from_chars_result_type<unsigned_int> _Var12;
  uint i;
  ostringstream oss;
  undefined1 auStack_1d8 [4];
  uint local_1d4;
  _List_node_base *local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  
  this->measure = 0;
  this->max_steps = 100;
  this->help_required = false;
  local_1d0 = (_List_node_base *)&this->capacities;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = local_1d0;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = local_1d0;
  (this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  bVar11 = false;
  bVar10 = false;
  do {
    bVar3 = false;
    iVar4 = getopt_long(argc,argv,"a:m:s:h",params::long_options,0);
    pcVar2 = _optarg;
    if (iVar4 < 0x68) {
      if (iVar4 == -1) goto LAB_00104226;
      if (iVar4 == 0x61) {
        iVar4 = anon_unknown.dwarf_fcb1::parse<int>(_optarg);
        if (iVar4 < 1) {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar8,"Bucket capacity must be greater than 0");
          __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        p_Var6 = (_List_node_base *)operator_new(0x18);
        *(int *)&p_Var6[1]._M_next = iVar4;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(this->capacities).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 + 1;
      }
      else if (iVar4 == 0x3f) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Invalid argument");
        goto LAB_001043b8;
      }
LAB_00104224:
      bVar3 = true;
    }
    else {
      if (iVar4 == 0x68) {
        this->help_required = true;
        goto LAB_00104224;
      }
      if (iVar4 == 0x6d) {
        if (bVar10) {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar8,"Measurement was already specified");
LAB_001043b8:
          __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        iVar4 = anon_unknown.dwarf_fcb1::parse<int>(_optarg);
        this->measure = iVar4;
        bVar3 = true;
        bVar10 = true;
        if (iVar4 < 1) {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar8,"Invalid measurement, must be greater than 0");
          goto LAB_001043b8;
        }
      }
      else {
        if (iVar4 != 0x73) goto LAB_00104224;
        if (bVar11) {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar8,"Max number of steps already specified");
          goto LAB_001043b8;
        }
        local_1d4 = 0;
        sVar5 = strlen(_optarg);
        _Var12 = std::from_chars<unsigned_int>(pcVar2,pcVar2 + sVar5,&local_1d4,10);
        if (*_Var12.ptr != '\0') {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_1c8[0] = local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"Invalid argument: ","");
          plVar7 = (long *)std::__cxx11::string::append((char *)local_1c8);
          local_1a8 = (long *)*plVar7;
          plVar9 = plVar7 + 2;
          if (local_1a8 == plVar9) {
            local_198 = *plVar9;
            lStack_190 = plVar7[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *plVar9;
          }
          local_1a0 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar8,(string *)&local_1a8);
          __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        this->max_steps = local_1d4;
        bVar3 = true;
        bVar11 = true;
        if (local_1d4 == 0) {
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar8,"Invalid maximum number of steps");
          goto LAB_001043b8;
        }
      }
    }
LAB_00104226:
    if (!bVar3) {
      if (_optind < argc) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"invalid argument: ",0x12);
        if (_optind < argc) {
          do {
            pcVar2 = argv[_optind];
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)auStack_1d8 + (int)*(undefined8 *)((long)local_1a8 + -0x18) +
                              0x30);
            }
            else {
              sVar5 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar5)
              ;
            }
            local_1c8[0] = (undefined1 *)CONCAT71(local_1c8[0]._1_7_,0x20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)local_1c8,1);
            _optind = _optind + 1;
          } while (_optind < argc);
        }
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar8,(string *)local_1c8);
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if (this->help_required != false) {
        return;
      }
      p_Var6 = (((_List_base<int,_std::allocator<int>_> *)&local_1d0->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      if (p_Var6 == local_1d0) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"No buckets were added");
      }
      else {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + *(int *)&p_Var6[1]._M_next;
          p_Var6 = p_Var6->_M_next;
        } while (p_Var6 != local_1d0);
        if (this->measure <= iVar4) {
          return;
        }
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar8,"Required measurement exceeds total bucket capacity");
      }
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  } while( true );
}

Assistant:

params::params(const int argc, char* argv[])
{
	bool measurement_specified = false;
	bool max_steps_specified = false;

	while (true) {
		static option long_options[] = {
			{"add-bucket", true, nullptr, 'a'},
			{"measure", true, nullptr, 'm'},
			{"max-steps", true, nullptr, 's'},
			{"help", false, nullptr, 'h'},
			{nullptr, false, nullptr, 0}
		};

		int c = getopt_long(argc, argv, "a:m:s:h", long_options, nullptr);
		if (c == -1)
			break;

		switch (c) {
		case 'a' : {
			int capacity = parse<int>(optarg);
			if (capacity < 1)
				throw std::invalid_argument{
					"Bucket capacity must be greater than 0"};
			capacities.emplace_back(capacity);
			break;
		}
		case 'm' : {
			if (measurement_specified)
				throw std::invalid_argument{
					"Measurement was already specified"};
			measurement_specified = true;
			measure = parse<int>(optarg);
			if (measure < 1)
				throw std::invalid_argument{
					"Invalid measurement, must be greater than 0"};
			break;
		}
		case 's' : {
			if (max_steps_specified)
				throw std::invalid_argument{
					"Max number of steps already specified"};
			max_steps_specified = true;
			max_steps = parse<unsigned>(optarg);
			if (max_steps < 1)
				throw std::invalid_argument{
					"Invalid maximum number of steps"};
			break;
		}
		case 'h' :
			help_required = true;
			break;
		case '?' :
			throw std::invalid_argument{"Invalid argument"};
			break;
		}
	}

	if (optind < argc) {
		std::ostringstream oss;
		oss << "invalid argument: ";
		for (; optind < argc; ++optind)
			oss << argv[optind] << ' ';
		throw std::invalid_argument{oss.str()};
	}

	if (!help_required) {
		try {
			if (capacities.empty())
				throw std::invalid_argument{"No buckets were added"};
			if (std::accumulate(capacities.begin(), capacities.end(), 0) < measure)
				throw std::invalid_argument{
					"Required measurement exceeds total bucket capacity"};
		}
		catch (const std::exception& e) {
			help_required = true;
			std::ostringstream oss;
			oss << e.what() << "\n\n" << help;
			throw std::invalid_argument{oss.str()};
		}
	}
}